

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libpath.cpp
# Opt level: O0

string * fs_lib_path_abi_cxx11_(void)

{
  string *in_RDI;
  
  fs_print_error("","fs_lib_path");
  std::__cxx11::string::string((string *)in_RDI);
  return in_RDI;
}

Assistant:

std::string fs_lib_path()
{

#if (defined(_WIN32) || defined(__CYGWIN__)) && defined(FS_DLL_NAME)
 // https://learn.microsoft.com/en-us/windows/win32/api/libloaderapi/nf-libloaderapi-getmodulefilenamea

  std::string path(fs_get_max_path(), '\0');

  if(DWORD L = GetModuleFileNameA(GetModuleHandleA(FS_DLL_NAME), path.data(), static_cast<DWORD>(path.size()));
      L > 0 && GetLastError() != ERROR_INSUFFICIENT_BUFFER)  FFS_LIKELY
  {
    path.resize(L);
    return fs_as_posix(path);
  }
#elif defined(HAVE_DLADDR)
  if(Dl_info info; dladdr(reinterpret_cast<void*>(&dl_dummy_func), &info))  FFS_LIKELY
    return info.dli_fname;
#endif

  fs_print_error("", __func__);
  return {};
}